

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_array.h
# Opt level: O3

float linear_kernel(flat_example *fec1,flat_example *fec2)

{
  unsigned_long *puVar1;
  float *pfVar2;
  float *pfVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  float fVar11;
  
  puVar1 = (fec2->fs).indicies._begin;
  fVar11 = 0.0;
  if ((fec2->fs).indicies._end != puVar1) {
    pfVar2 = (fec1->fs).values._begin;
    lVar6 = (long)(fec1->fs).values._end - (long)pfVar2;
    if (lVar6 != 0) {
      lVar6 = lVar6 >> 2;
      pfVar3 = (fec2->fs).values._begin;
      uVar7 = (long)(fec2->fs).values._end - (long)pfVar3 >> 2;
      fVar11 = 0.0;
      uVar9 = 0;
      lVar8 = 0;
      do {
        if (uVar7 <= uVar9) {
          return fVar11;
        }
        uVar4 = (fec1->fs).indicies._begin[lVar8];
        uVar10 = puVar1[uVar9];
        if (uVar10 <= uVar4) {
          uVar5 = uVar9;
          if ((uVar10 < uVar4) && (uVar5 = uVar7, uVar9 != uVar7 - 1)) {
            uVar9 = uVar9 + 1;
            do {
              uVar10 = puVar1[uVar9];
              uVar5 = uVar9;
              if (uVar4 <= uVar10) break;
              uVar9 = uVar9 + 1;
              uVar5 = uVar7;
            } while (uVar7 != uVar9);
          }
          uVar9 = uVar5;
          if (uVar4 == uVar10) {
            fVar11 = fVar11 + pfVar2[lVar8] * pfVar3[uVar9];
            uVar9 = uVar9 + 1;
          }
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != lVar6 + (ulong)(lVar6 == 0));
    }
  }
  return fVar11;
}

Assistant:

T& operator[](size_t i) const { return _begin[i]; }